

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O2

char * Scl_LibertyReadString(Scl_Tree_t *p,Scl_Pair_t Pair)

{
  int nCapMin;
  long lVar1;
  int iVar2;
  int iVar3;
  size_t __n;
  Vec_Str_t *p_00;
  char *__dest;
  
  iVar2 = Pair.Beg;
  iVar3 = Pair.End - iVar2;
  p_00 = p->vBuffer;
  if (p_00->nSize < iVar3 + 2) {
    nCapMin = iVar3 + 100;
    Vec_StrGrow(p_00,nCapMin);
    p_00->nSize = nCapMin;
    for (lVar1 = 0; lVar1 < nCapMin; lVar1 = lVar1 + 1) {
      p_00->pArray[lVar1] = '\0';
      nCapMin = p_00->nSize;
    }
    p_00 = p->vBuffer;
  }
  __dest = p_00->pArray;
  __n = (size_t)iVar3;
  strncpy(__dest,p->pContents + iVar2,__n);
  if ((iVar2 < Pair.End) && (*__dest == '\"')) {
    if (__dest[__n - 1] != '\"') {
      __assert_fail("Buffer[Pair.End-Pair.Beg-1] == \'\\\"\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLiberty.c"
                    ,0x160,"char *Scl_LibertyReadString(Scl_Tree_t *, Scl_Pair_t)");
    }
    __dest[__n - 1] = '\0';
    __dest = __dest + 1;
  }
  else {
    __dest[__n] = '\0';
  }
  return __dest;
}

Assistant:

char * Scl_LibertyReadString( Scl_Tree_t * p, Scl_Pair_t Pair )   
{ 
    // static char Buffer[ABC_MAX_LIB_STR_LEN]; 
    char * Buffer;
    if ( Pair.End - Pair.Beg + 2 > Vec_StrSize(p->vBuffer) )
        Vec_StrFill( p->vBuffer, Pair.End - Pair.Beg + 100, '\0' );
    Buffer = Vec_StrArray( p->vBuffer );
    strncpy( Buffer, p->pContents+Pair.Beg, Pair.End-Pair.Beg ); 
    if ( Pair.Beg < Pair.End && Buffer[0] == '\"' )
    {
        assert( Buffer[Pair.End-Pair.Beg-1] == '\"' );
        Buffer[Pair.End-Pair.Beg-1] = 0;
        return Buffer + 1;
    }
    Buffer[Pair.End-Pair.Beg] = 0;
    return Buffer;
}